

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pid.c
# Opt level: O3

inform_pid_lattice *
inform_pid(int *stimulus,int *responses,size_t l,size_t n,int bs,int *br,inform_error *err)

{
  uint64_t uVar1;
  uint32_t *puVar2;
  bool bVar3;
  _Bool _Var4;
  inform_error iVar5;
  size_t i;
  size_t sVar6;
  size_t *psVar7;
  size_t *psVar8;
  inform_dist *piVar9;
  gvector pvVar10;
  int *piVar11;
  uint *__s;
  inform_pid_source **ppiVar12;
  inform_pid_source *piVar13;
  inform_pid_source **ppiVar14;
  inform_pid_lattice *piVar15;
  long lVar16;
  uint *puVar17;
  uint uVar18;
  size_t sVar19;
  int *piVar20;
  size_t sVar21;
  ulong uVar22;
  uint *puVar23;
  size_t s;
  ulong uVar24;
  gvector pvVar25;
  size_t sVar26;
  ulong uVar27;
  size_t k;
  bool bVar28;
  double dVar29;
  double dVar30;
  undefined1 auVar31 [16];
  double dVar32;
  undefined4 uVar33;
  undefined4 uVar34;
  EVP_PKEY_CTX *local_f8;
  ulong local_e8;
  
  if (stimulus == (int *)0x0 || responses == (int *)0x0) {
    iVar5 = INFORM_ETIMESERIES;
    goto LAB_0015a388;
  }
  if (l == 0) {
    iVar5 = INFORM_ENOSOURCES;
    goto LAB_0015a388;
  }
  if (n == 0) {
    iVar5 = INFORM_ESHORTSERIES;
    goto LAB_0015a388;
  }
  if ((bs < 2) || (br == (int *)0x0)) {
LAB_0015a37c:
    iVar5 = INFORM_EBASE;
    goto LAB_0015a388;
  }
  sVar6 = 0;
  do {
    if (br[sVar6] < 2) goto LAB_0015a37c;
    sVar6 = sVar6 + 1;
  } while (l != sVar6);
  sVar6 = 0;
  do {
    if (stimulus[sVar6] < 0) goto LAB_0015a3a7;
    if (bs <= stimulus[sVar6]) goto LAB_0015a3ae;
    sVar6 = sVar6 + 1;
  } while (n != sVar6);
  sVar6 = 0;
  piVar11 = responses;
  do {
    sVar19 = 0;
    do {
      if (piVar11[sVar19] < 0) goto LAB_0015a3a7;
      if (br[sVar6] <= piVar11[sVar19]) goto LAB_0015a3ae;
      sVar19 = sVar19 + 1;
    } while (n != sVar19);
    sVar6 = sVar6 + 1;
    piVar11 = piVar11 + n;
  } while (sVar6 != l);
  uVar24 = (ulong)(1 << ((byte)l & 0x1f));
  local_f8 = (EVP_PKEY_CTX *)gvector_alloc(uVar24 - 1,uVar24 - 1,8);
  memset(local_f8,0,*(long *)(local_f8 + -8) << 3);
  if ((int)l == 0) {
LAB_0015a341:
    if (err == (inform_error *)0x0) goto LAB_0015a405;
    if (*err != INFORM_SUCCESS) {
      return (inform_pid_lattice *)0x0;
    }
    bVar3 = false;
  }
  else {
    uVar22 = 2;
    if (2 < uVar24) {
      uVar22 = uVar24;
    }
    local_e8 = 1;
    while( true ) {
      psVar7 = (size_t *)gvector_alloc(l,0,8);
      if (psVar7 == (size_t *)0x0) {
        if (*(long *)(local_f8 + -8) != 0) {
          uVar24 = 0;
          do {
            gvector_free(*(gvector *)(local_f8 + uVar24 * 8));
            uVar24 = uVar24 + 1;
          } while (uVar24 < *(ulong *)(local_f8 + -8));
        }
        goto LAB_0015a3e7;
      }
      sVar6 = 0;
      do {
        psVar8 = psVar7;
        if (((local_e8 & (long)(1 << ((byte)sVar6 & 0x1f))) != 0) &&
           (psVar8 = push_value(psVar7,sVar6), psVar8 == (size_t *)0x0)) {
          gvector_free(psVar7);
          if (*(long *)(local_f8 + -8) != 0) {
            uVar24 = 0;
            do {
              gvector_free(*(gvector *)(local_f8 + uVar24 * 8));
              uVar24 = uVar24 + 1;
            } while (uVar24 < *(ulong *)(local_f8 + -8));
          }
          goto LAB_0015a3e7;
        }
        psVar7 = psVar8;
        sVar6 = sVar6 + 1;
      } while (l != sVar6);
      pvVar10 = gvector_shrink(psVar7);
      if (pvVar10 == (gvector)0x0) break;
      *(gvector *)(local_f8 + local_e8 * 8 + -8) = pvVar10;
      local_e8 = local_e8 + 1;
      if (local_e8 == uVar22) goto LAB_0015a341;
    }
    gvector_free(psVar7);
    if (*(long *)(local_f8 + -8) != 0) {
      uVar24 = 0;
      do {
        gvector_free(*(gvector *)(local_f8 + uVar24 * 8));
        uVar24 = uVar24 + 1;
      } while (uVar24 < *(ulong *)(local_f8 + -8));
    }
LAB_0015a3e7:
    gvector_free(local_f8);
    if (err != (inform_error *)0x0) goto LAB_0015a97d;
    local_f8 = (EVP_PKEY_CTX *)0x0;
LAB_0015a405:
    bVar3 = true;
  }
  sVar6 = *(size_t *)(local_f8 + -8);
  piVar9 = inform_dist_infer(stimulus,n);
  if ((piVar9 == (inform_dist *)0x0) ||
     (pvVar10 = gvector_alloc(sVar6,sVar6,8), pvVar10 == (gvector)0x0)) {
    cleanup(local_f8);
    if (bVar3) {
      return (inform_pid_lattice *)0x0;
    }
LAB_0015a97d:
    *err = INFORM_ENOMEM;
    return (inform_pid_lattice *)0x0;
  }
  if (sVar6 != 0) {
    memset(pvVar10,0,sVar6 * 8);
    sVar19 = 0;
    auVar31._8_4_ = (int)(n >> 0x20);
    auVar31._0_8_ = n;
    auVar31._12_4_ = 0x45300000;
    uVar24 = (ulong)(uint)bs;
    do {
      lVar16 = *(long *)(local_f8 + sVar19 * 8);
      sVar26 = *(size_t *)(lVar16 + -8);
      sVar21 = (sVar26 + 1) * n;
      piVar11 = (int *)gvector_alloc(sVar21,sVar21,4);
      if (piVar11 == (int *)0x0) {
LAB_0015a80d:
        if (!bVar3) {
          *err = INFORM_ENOMEM;
          *(undefined8 *)((long)pvVar10 + sVar19 * 8) = 0;
          goto LAB_0015acbb;
        }
        *(undefined8 *)((long)pvVar10 + sVar19 * 8) = 0;
      }
      else {
        if (sVar26 != 0) {
          sVar21 = 0;
          piVar20 = piVar11;
          do {
            memcpy(piVar20,responses + *(long *)(lVar16 + sVar21 * 8) * n,n * 4);
            sVar21 = sVar21 + 1;
            piVar20 = piVar20 + n;
          } while (sVar26 != sVar21);
        }
        piVar20 = piVar11 + sVar26 * n;
        inform_black_box(piVar11,sVar26,1,n,br,(size_t *)0x0,(size_t *)0x0,piVar20,err);
        _Var4 = inform_failed(err);
        pvVar25 = (gvector)0x0;
        if (!_Var4) {
          uVar18 = 1;
          if (sVar26 != 0) {
            sVar21 = 0;
            do {
              uVar18 = uVar18 * br[*(long *)(lVar16 + sVar21 * 8)];
              sVar21 = sVar21 + 1;
            } while (sVar26 != sVar21);
          }
          lVar16 = (long)(int)(uVar18 * bs);
          sVar26 = (int)uVar18 + lVar16;
          __s = (uint *)gvector_alloc(sVar26,sVar26,4);
          if (__s != (uint *)0x0) {
            if (sVar26 != 0) {
              memset(__s,0,sVar26 * 4);
            }
            sVar26 = 0;
            do {
              __s[lVar16 + piVar20[sVar26]] = __s[lVar16 + piVar20[sVar26]] + 1;
              __s[(long)piVar20[sVar26] * (long)bs + (long)stimulus[sVar26]] =
                   __s[(long)piVar20[sVar26] * (long)bs + (long)stimulus[sVar26]] + 1;
              sVar26 = sVar26 + 1;
            } while (n != sVar26);
            pvVar25 = gvector_alloc(uVar24,uVar24,8);
            if (pvVar25 != (gvector)0x0) {
              uVar22 = 0;
              puVar17 = __s;
              do {
                *(undefined8 *)((long)pvVar25 + uVar22 * 8) = 0;
                if (piVar9->histogram[uVar22] != 0) {
                  dVar29 = (double)piVar9->histogram[uVar22];
                  dVar30 = 0.0;
                  if (0 < (int)uVar18) {
                    uVar27 = 0;
                    puVar23 = puVar17;
                    do {
                      if ((__s[lVar16 + uVar27] != 0) && (*puVar23 != 0)) {
                        dVar32 = (double)*puVar23;
                        dVar30 = log2((((auVar31._8_8_ - 1.9342813113834067e+25) +
                                       ((double)CONCAT44(0x43300000,(int)n) - 4503599627370496.0)) *
                                      dVar32) / ((double)__s[lVar16 + uVar27] * dVar29));
                        dVar30 = dVar30 * dVar32 + *(double *)((long)pvVar25 + uVar22 * 8);
                        *(double *)((long)pvVar25 + uVar22 * 8) = dVar30;
                      }
                      uVar27 = uVar27 + 1;
                      puVar23 = puVar23 + uVar24;
                    } while (uVar18 != uVar27);
                  }
                  *(double *)((long)pvVar25 + uVar22 * 8) = dVar30 / dVar29;
                }
                uVar22 = uVar22 + 1;
                puVar17 = puVar17 + 1;
              } while (uVar22 != uVar24);
              gvector_free(__s);
              goto LAB_0015a7c8;
            }
            gvector_free(__s);
          }
          gvector_free(piVar11);
          goto LAB_0015a80d;
        }
LAB_0015a7c8:
        gvector_free(piVar11);
        *(gvector *)((long)pvVar10 + sVar19 * 8) = pvVar25;
        if ((!bVar3) && (*err != INFORM_SUCCESS)) goto LAB_0015acbb;
      }
      sVar19 = sVar19 + 1;
    } while (sVar19 != sVar6);
  }
  ppiVar12 = (inform_pid_source **)gvector_alloc(0,0,8);
  if (ppiVar12 == (inform_pid_source **)0x0) {
LAB_0015aa39:
    if (!bVar3) {
      *err = INFORM_ENOMEM;
LAB_0015acbb:
      cleanup(local_f8);
      return (inform_pid_lattice *)0x0;
    }
    ppiVar14 = (inform_pid_source **)0x0;
  }
  else {
    if ((int)l != 0) {
      uVar24 = (ulong)(uint)~(-1 << ((byte)l & 0x1f));
      sVar6 = 1;
      do {
        psVar7 = (size_t *)gvector_alloc(1,1,8);
        if (psVar7 == (size_t *)0x0) goto LAB_0015aa39;
        *psVar7 = sVar6;
        piVar13 = alloc_source(psVar7,err);
        if ((!bVar3) && (*err != INFORM_SUCCESS)) {
          gvector_free(psVar7);
LAB_0015ac77:
          ppiVar14 = (inform_pid_source **)0x0;
          goto LAB_0015ac79;
        }
        ppiVar14 = push_source(ppiVar12,piVar13);
        if (ppiVar14 == (inform_pid_source **)0x0) {
          free_source(piVar13);
          free_all_sources(ppiVar12);
          gvector_free(psVar7);
          goto LAB_0015aa39;
        }
        ppiVar12 = sources_rec(sVar6 + 1,uVar24,psVar7,ppiVar14,err);
        if ((!bVar3) && (*err != INFORM_SUCCESS)) {
          free_all_sources(ppiVar12);
          goto LAB_0015ac77;
        }
        bVar28 = sVar6 != uVar24 + (uVar24 == 0);
        sVar6 = sVar6 + 1;
      } while (bVar28);
    }
    ppiVar14 = (inform_pid_source **)gvector_shrink(ppiVar12);
    if (ppiVar14 == (inform_pid_source **)0x0) {
      free_all_sources(ppiVar12);
      goto LAB_0015aa39;
    }
    if (!bVar3) {
LAB_0015ac79:
      if (((*err == INFORM_SUCCESS) && (toposort(ppiVar14,err), *err == INFORM_SUCCESS)) &&
         (piVar15 = build_hasse(ppiVar14,err), *err == INFORM_SUCCESS)) goto LAB_0015aa50;
      goto LAB_0015acbb;
    }
    toposort(ppiVar14,(inform_error *)0x0);
  }
  piVar15 = build_hasse(ppiVar14,(inform_error *)0x0);
LAB_0015aa50:
  sVar6 = piVar15->size;
  if (sVar6 != 0) {
    ppiVar12 = piVar15->sources;
    uVar1 = piVar9->counts;
    puVar2 = piVar9->histogram;
    sVar19 = 0;
    do {
      piVar13 = ppiVar12[sVar19];
      piVar13->imin = 0.0;
      lVar16 = *(long *)((long)pvVar10 + *piVar13->name * 8 + -8);
      dVar29 = 0.0;
      uVar24 = 0;
      do {
        dVar30 = *(double *)(lVar16 + uVar24 * 8);
        if (1 < piVar13->size) {
          uVar22 = 1;
          do {
            dVar32 = *(double *)
                      (*(long *)((long)pvVar10 + piVar13->name[uVar22] * 8 + -8) + uVar24 * 8);
            if (dVar32 <= dVar30) {
              dVar30 = dVar32;
            }
            uVar22 = uVar22 + 1;
          } while (piVar13->size != uVar22);
        }
        dVar29 = dVar29 + (double)puVar2[uVar24] * dVar30;
        piVar13->imin = dVar29;
        uVar24 = uVar24 + 1;
      } while (uVar24 != (uint)bs);
      piVar13->imin =
           dVar29 / (((double)CONCAT44(0x45300000,(int)(uVar1 >> 0x20)) - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0));
      sVar19 = sVar19 + 1;
    } while (sVar19 != sVar6);
    ppiVar12 = piVar15->sources;
    puVar2 = piVar9->histogram;
    uVar1 = piVar9->counts;
    sVar19 = 0;
    do {
      piVar13 = ppiVar12[sVar19];
      dVar29 = piVar13->pi;
      uVar24 = 0;
      do {
        uVar33 = 0;
        uVar34 = 0xfff00000;
        if (piVar13->n_below != 0) {
          sVar26 = 0;
          do {
            psVar7 = piVar13->below[sVar26]->name;
            uVar22 = piVar13->below[sVar26]->size;
            dVar30 = *(double *)(*(long *)((long)pvVar10 + *psVar7 * 8 + -8) + uVar24 * 8);
            if (1 < uVar22) {
              uVar27 = 1;
              do {
                dVar32 = *(double *)
                          (*(long *)((long)pvVar10 + psVar7[uVar27] * 8 + -8) + uVar24 * 8);
                if (dVar32 <= dVar30) {
                  dVar30 = dVar32;
                }
                uVar27 = uVar27 + 1;
              } while (uVar22 != uVar27);
            }
            if ((double)CONCAT44(uVar34,uVar33) <= dVar30) {
              uVar33 = SUB84(dVar30,0);
              uVar34 = (undefined4)((ulong)dVar30 >> 0x20);
            }
            sVar26 = sVar26 + 1;
          } while (sVar26 != piVar13->n_below);
        }
        dVar30 = 0.0;
        if ((CONCAT44(uVar34,uVar33) & 0x7fffffffffffffff) != 0x7ff0000000000000) {
          dVar30 = (double)CONCAT44(uVar34,uVar33);
        }
        dVar29 = dVar29 + (double)puVar2[uVar24] * dVar30;
        piVar13->pi = dVar29;
        uVar24 = uVar24 + 1;
      } while (uVar24 != (uint)bs);
      piVar13->pi = piVar13->imin -
                    dVar29 / (((double)CONCAT44(0x45300000,(int)(uVar1 >> 0x20)) -
                              1.9342813113834067e+25) +
                             ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0));
      sVar19 = sVar19 + 1;
    } while (sVar19 != sVar6);
  }
  cleanup(local_f8);
  return piVar15;
LAB_0015a3a7:
  iVar5 = INFORM_ENEGSTATE;
  goto LAB_0015a388;
LAB_0015a3ae:
  iVar5 = INFORM_EBADSTATE;
LAB_0015a388:
  if (err != (inform_error *)0x0) {
    *err = iVar5;
  }
  return (inform_pid_lattice *)0x0;
}

Assistant:

inform_pid_lattice *inform_pid(int const *stimulus, int const *responses,
        size_t l, size_t n, int bs, int const *br, inform_error *err)
{
    if (check_arguments(stimulus, responses, l, n, bs, br, err))
    {
        return NULL;
    }
    size_t **ss = subsets(l, err);
    if (FAILED(err))
    {
        return NULL;
    }

    size_t const m = gvector_len(ss);

    inform_dist *s_dist = inform_dist_infer(stimulus, n);
    if (s_dist == NULL)
    {
        cleanup(ss, NULL, NULL);
        INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NULL);
    }

    double **si = gvector_alloc(m, m, sizeof(double*));
    if (si == NULL)
    {
        cleanup(ss, s_dist, si);
        INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NULL);
    }
    for (size_t i = 0; i < m; ++i) si[i] = NULL;
    for (size_t i = 0; i < m; ++i)
    {
        si[i] = specific_info(stimulus, responses, l, n, bs, br, ss[i], s_dist, err);
        if (FAILED(err))
        {
            cleanup(ss, s_dist, si);
            return NULL;
        }
    }

    inform_pid_lattice *lattice = hasse(l, err);
    if (FAILED(err))
    {
        cleanup(ss, s_dist, si);
        return NULL;
    }

    for (size_t i = 0; i < lattice->size; ++i)
    {
        inform_pid_source *alpha = lattice->sources[i];
        alpha->imin = 0.0;
        for (size_t s = 0; s < (size_t)bs; ++s)
        {
            double x = si[alpha->name[0]-1][s];
            for (size_t k = 1; k < alpha->size; ++k)
            {
                x = MIN(x, si[alpha->name[k]-1][s]);
            }
            alpha->imin += s_dist->histogram[s] * x;
        }
        alpha->imin /= s_dist->counts;
    }

    for (size_t i = 0; i < lattice->size; ++i)
    {
        inform_pid_source *alpha = lattice->sources[i];
        for (size_t s = 0; s < (size_t)bs; ++s)
        {
            double u = -INFINITY;
            for (size_t j = 0; j < alpha->n_below; ++j)
            {
                inform_pid_source *beta = alpha->below[j];
                double x = si[beta->name[0]-1][s];
                for (size_t k = 1; k < beta->size; ++k)
                {
                    x = MIN(x, si[beta->name[k]-1][s]);
                }
                u = MAX(u, x);
            }
            if (isinf(u))
            {
                u = 0.0;
            }
            alpha->pi += s_dist->histogram[s] * u;
        }
        alpha->pi = alpha->imin - alpha->pi / s_dist->counts;
    }

    cleanup(ss, s_dist, si);

    return lattice;
}